

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_ERET(DisasContext_conflict1 *s,arg_ERET *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  TCGv_i32 local_30;
  TCGv_i32 tmp;
  TCGContext_conflict1 *tcg_ctx;
  arg_ERET *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = arm_dc_feature(s,0xd);
  if (iVar1 == 0) {
    s_local._7_1_ = false;
  }
  else if (s->user == 0) {
    if (s->current_el == 2) {
      local_30 = load_cpu_offset(tcg_ctx_00,0x248);
    }
    else {
      local_30 = load_reg(s,0xe);
    }
    gen_exception_return(s,local_30);
    s_local._7_1_ = true;
  }
  else {
    unallocated_encoding_aarch64(s);
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_ERET(DisasContext *s, arg_ERET *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    if (!arm_dc_feature(s, ARM_FEATURE_V7VE)) {
        return false;
    }
    if (IS_USER(s)) {
        unallocated_encoding(s);
        return true;
    }
    if (s->current_el == 2) {
        /* ERET from Hyp uses ELR_Hyp, not LR */
        tmp = load_cpu_field(tcg_ctx, elr_el[2]);
    } else {
        tmp = load_reg(s, 14);
    }
    gen_exception_return(s, tmp);
    return true;
}